

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_rust.cpp
# Opt level: O0

void __thiscall
flatbuffers::rust::RustGenerator::GenUnionObject(RustGenerator *this,EnumDef *enum_def)

{
  EnumDef *pEVar1;
  allocator<char> local_531;
  string local_530;
  anon_class_8_1_8991fb9c local_510;
  function<void_()> local_508;
  allocator<char> local_4e1;
  string local_4e0;
  allocator<char> local_4b9;
  string local_4b8;
  anon_class_8_1_8991fb9c local_498;
  function<void_()> local_490;
  allocator<char> local_469;
  string local_468;
  allocator<char> local_441;
  string local_440;
  allocator<char> local_419;
  string local_418;
  allocator<char> local_3f1;
  string local_3f0;
  allocator<char> local_3c9;
  string local_3c8;
  anon_class_8_1_8991fb9c local_3a8;
  function<void_()> local_3a0;
  allocator<char> local_379;
  string local_378;
  allocator<char> local_351;
  string local_350;
  allocator<char> local_329;
  string local_328;
  allocator<char> local_301;
  string local_300;
  allocator<char> local_2d9;
  string local_2d8;
  allocator<char> local_2b1;
  string local_2b0;
  allocator<char> local_289;
  string local_288;
  allocator<char> local_261;
  string local_260;
  allocator<char> local_239;
  string local_238;
  allocator<char> local_211;
  string local_210;
  anon_class_8_1_8991fb9c local_1f0;
  function<void_()> local_1e8;
  allocator<char> local_1c1;
  string local_1c0;
  allocator<char> local_199;
  string local_198;
  allocator<char> local_171;
  string local_170;
  allocator<char> local_149;
  string local_148;
  allocator<char> local_121;
  string local_120;
  string local_100;
  allocator<char> local_d9;
  string local_d8;
  string local_b8;
  allocator<char> local_91;
  string local_90;
  string local_70;
  allocator<char> local_39;
  string local_38;
  EnumDef *local_18;
  EnumDef *enum_def_local;
  RustGenerator *this_local;
  
  local_18 = enum_def;
  enum_def_local = (EnumDef *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"ENUM_TY",&local_39);
  IdlNamer::Type_abi_cxx11_(&local_70,&this->namer_,local_18);
  CodeWriter::SetValue(&this->code_,&local_38,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"ENUM_FN",&local_91);
  IdlNamer::Function_abi_cxx11_(&local_b8,&this->namer_,&local_18->super_Definition);
  CodeWriter::SetValue(&this->code_,&local_90,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator(&local_91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,"ENUM_OTY",&local_d9);
  IdlNamer::ObjectType_abi_cxx11_(&local_100,&this->namer_,local_18);
  CodeWriter::SetValue(&this->code_,&local_d8,&local_100);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&local_d8);
  std::allocator<char>::~allocator(&local_d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_120,"#[allow(clippy::upper_case_acronyms)]",&local_121);
  CodeWriter::operator+=(&this->code_,&local_120);
  std::__cxx11::string::~string((string *)&local_120);
  std::allocator<char>::~allocator(&local_121);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"#[non_exhaustive]",&local_149);
  CodeWriter::operator+=(&this->code_,&local_148);
  std::__cxx11::string::~string((string *)&local_148);
  std::allocator<char>::~allocator(&local_149);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_170,"#[derive(Debug, Clone, PartialEq)]",&local_171);
  CodeWriter::operator+=(&this->code_,&local_170);
  std::__cxx11::string::~string((string *)&local_170);
  std::allocator<char>::~allocator(&local_171);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_198,"{{ACCESS_TYPE}} enum {{ENUM_OTY}} {",&local_199);
  CodeWriter::operator+=(&this->code_,&local_198);
  std::__cxx11::string::~string((string *)&local_198);
  std::allocator<char>::~allocator(&local_199);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c0,"  NONE,",&local_1c1);
  CodeWriter::operator+=(&this->code_,&local_1c0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::allocator<char>::~allocator(&local_1c1);
  pEVar1 = local_18;
  local_1f0.this = this;
  std::function<void()>::
  function<flatbuffers::rust::RustGenerator::GenUnionObject(flatbuffers::EnumDef_const&)::_lambda()_1_,void>
            ((function<void()> *)&local_1e8,&local_1f0);
  ForAllUnionObjectVariantsBesidesNone(this,pEVar1,&local_1e8);
  std::function<void_()>::~function(&local_1e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_210,"}",&local_211);
  CodeWriter::operator+=(&this->code_,&local_210);
  std::__cxx11::string::~string((string *)&local_210);
  std::allocator<char>::~allocator(&local_211);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_238,"impl Default for {{ENUM_OTY}} {",&local_239);
  CodeWriter::operator+=(&this->code_,&local_238);
  std::__cxx11::string::~string((string *)&local_238);
  std::allocator<char>::~allocator(&local_239);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_260,"  fn default() -> Self {",&local_261);
  CodeWriter::operator+=(&this->code_,&local_260);
  std::__cxx11::string::~string((string *)&local_260);
  std::allocator<char>::~allocator(&local_261);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_288,"    Self::NONE",&local_289);
  CodeWriter::operator+=(&this->code_,&local_288);
  std::__cxx11::string::~string((string *)&local_288);
  std::allocator<char>::~allocator(&local_289);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2b0,"  }",&local_2b1);
  CodeWriter::operator+=(&this->code_,&local_2b0);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::allocator<char>::~allocator(&local_2b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2d8,"}",&local_2d9);
  CodeWriter::operator+=(&this->code_,&local_2d8);
  std::__cxx11::string::~string((string *)&local_2d8);
  std::allocator<char>::~allocator(&local_2d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_300,"impl {{ENUM_OTY}} {",&local_301);
  CodeWriter::operator+=(&this->code_,&local_300);
  std::__cxx11::string::~string((string *)&local_300);
  std::allocator<char>::~allocator(&local_301);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_328,"  pub fn {{ENUM_FN}}_type(&self) -> {{ENUM_TY}} {",&local_329);
  CodeWriter::operator+=(&this->code_,&local_328);
  std::__cxx11::string::~string((string *)&local_328);
  std::allocator<char>::~allocator(&local_329);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_350,"    match self {",&local_351);
  CodeWriter::operator+=(&this->code_,&local_350);
  std::__cxx11::string::~string((string *)&local_350);
  std::allocator<char>::~allocator(&local_351);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_378,"      Self::NONE => {{ENUM_TY}}::NONE,",&local_379);
  CodeWriter::operator+=(&this->code_,&local_378);
  std::__cxx11::string::~string((string *)&local_378);
  std::allocator<char>::~allocator(&local_379);
  pEVar1 = local_18;
  local_3a8.this = this;
  std::function<void()>::
  function<flatbuffers::rust::RustGenerator::GenUnionObject(flatbuffers::EnumDef_const&)::_lambda()_2_,void>
            ((function<void()> *)&local_3a0,&local_3a8);
  ForAllUnionObjectVariantsBesidesNone(this,pEVar1,&local_3a0);
  std::function<void_()>::~function(&local_3a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3c8,"    }",&local_3c9);
  CodeWriter::operator+=(&this->code_,&local_3c8);
  std::__cxx11::string::~string((string *)&local_3c8);
  std::allocator<char>::~allocator(&local_3c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3f0,"  }",&local_3f1);
  CodeWriter::operator+=(&this->code_,&local_3f0);
  std::__cxx11::string::~string((string *)&local_3f0);
  std::allocator<char>::~allocator(&local_3f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_418,
             "  pub fn pack<\'b, A: flatbuffers::Allocator + \'b>(&self, fbb: &mut flatbuffers::FlatBufferBuilder<\'b, A>) -> Option<flatbuffers::WIPOffset<flatbuffers::UnionWIPOffset>> {"
             ,&local_419);
  CodeWriter::operator+=(&this->code_,&local_418);
  std::__cxx11::string::~string((string *)&local_418);
  std::allocator<char>::~allocator(&local_419);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_440,"    match self {",&local_441);
  CodeWriter::operator+=(&this->code_,&local_440);
  std::__cxx11::string::~string((string *)&local_440);
  std::allocator<char>::~allocator(&local_441);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_468,"      Self::NONE => None,",&local_469);
  CodeWriter::operator+=(&this->code_,&local_468);
  std::__cxx11::string::~string((string *)&local_468);
  std::allocator<char>::~allocator(&local_469);
  pEVar1 = local_18;
  local_498.this = this;
  std::function<void()>::
  function<flatbuffers::rust::RustGenerator::GenUnionObject(flatbuffers::EnumDef_const&)::_lambda()_3_,void>
            ((function<void()> *)&local_490,&local_498);
  ForAllUnionObjectVariantsBesidesNone(this,pEVar1,&local_490);
  std::function<void_()>::~function(&local_490);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4b8,"    }",&local_4b9);
  CodeWriter::operator+=(&this->code_,&local_4b8);
  std::__cxx11::string::~string((string *)&local_4b8);
  std::allocator<char>::~allocator(&local_4b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4e0,"  }",&local_4e1);
  CodeWriter::operator+=(&this->code_,&local_4e0);
  std::__cxx11::string::~string((string *)&local_4e0);
  std::allocator<char>::~allocator(&local_4e1);
  pEVar1 = local_18;
  local_510.this = this;
  std::function<void()>::
  function<flatbuffers::rust::RustGenerator::GenUnionObject(flatbuffers::EnumDef_const&)::_lambda()_4_,void>
            ((function<void()> *)&local_508,&local_510);
  ForAllUnionObjectVariantsBesidesNone(this,pEVar1,&local_508);
  std::function<void_()>::~function(&local_508);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_530,"}",&local_531);
  CodeWriter::operator+=(&this->code_,&local_530);
  std::__cxx11::string::~string((string *)&local_530);
  std::allocator<char>::~allocator(&local_531);
  return;
}

Assistant:

void GenUnionObject(const EnumDef &enum_def) {
    code_.SetValue("ENUM_TY", namer_.Type(enum_def));
    code_.SetValue("ENUM_FN", namer_.Function(enum_def));
    code_.SetValue("ENUM_OTY", namer_.ObjectType(enum_def));

    // Generate native union.
    code_ += "#[allow(clippy::upper_case_acronyms)]";  // NONE's spelling is
                                                       // intended.
    code_ += "#[non_exhaustive]";
    code_ += "#[derive(Debug, Clone, PartialEq)]";
    code_ += "{{ACCESS_TYPE}} enum {{ENUM_OTY}} {";
    code_ += "  NONE,";
    ForAllUnionObjectVariantsBesidesNone(enum_def, [&] {
      code_ += "{{NATIVE_VARIANT}}(Box<{{U_ELEMENT_TABLE_TYPE}}>),";
    });
    code_ += "}";
    // Generate Default (NONE).
    code_ += "impl Default for {{ENUM_OTY}} {";
    code_ += "  fn default() -> Self {";
    code_ += "    Self::NONE";
    code_ += "  }";
    code_ += "}";

    // Generate native union methods.
    code_ += "impl {{ENUM_OTY}} {";

    // Get flatbuffers union key.
    // TODO(cneo): add docstrings?
    code_ += "  pub fn {{ENUM_FN}}_type(&self) -> {{ENUM_TY}} {";
    code_ += "    match self {";
    code_ += "      Self::NONE => {{ENUM_TY}}::NONE,";
    ForAllUnionObjectVariantsBesidesNone(enum_def, [&] {
      code_ +=
          "    Self::{{NATIVE_VARIANT}}(_) => {{ENUM_TY}}::"
          "{{VARIANT_NAME}},";
    });
    code_ += "    }";
    code_ += "  }";
    // Pack flatbuffers union value
    code_ +=
        "  pub fn pack<'b, A: flatbuffers::Allocator + 'b>(&self, fbb: &mut "
        "flatbuffers::FlatBufferBuilder<'b, A>)"
        " -> Option<flatbuffers::WIPOffset<flatbuffers::UnionWIPOffset>>"
        " {";
    code_ += "    match self {";
    code_ += "      Self::NONE => None,";
    ForAllUnionObjectVariantsBesidesNone(enum_def, [&] {
      code_ += "    Self::{{NATIVE_VARIANT}}(v) => \\";
      code_ += "Some(v.pack(fbb).as_union_value()),";
    });
    code_ += "    }";
    code_ += "  }";

    // Generate some accessors;
    ForAllUnionObjectVariantsBesidesNone(enum_def, [&] {
      // Move accessor.
      code_ +=
          "/// If the union variant matches, return the owned "
          "{{U_ELEMENT_TABLE_TYPE}}, setting the union to NONE.";
      code_ +=
          "pub fn take_{{U_ELEMENT_NAME}}(&mut self) -> "
          "Option<Box<{{U_ELEMENT_TABLE_TYPE}}>> {";
      code_ += "  if let Self::{{NATIVE_VARIANT}}(_) = self {";
      code_ += "    let v = core::mem::replace(self, Self::NONE);";
      code_ += "    if let Self::{{NATIVE_VARIANT}}(w) = v {";
      code_ += "      Some(w)";
      code_ += "    } else {";
      code_ += "      unreachable!()";
      code_ += "    }";
      code_ += "  } else {";
      code_ += "    None";
      code_ += "  }";
      code_ += "}";
      // Immutable reference accessor.
      code_ +=
          "/// If the union variant matches, return a reference to the "
          "{{U_ELEMENT_TABLE_TYPE}}.";
      code_ +=
          "pub fn as_{{U_ELEMENT_NAME}}(&self) -> "
          "Option<&{{U_ELEMENT_TABLE_TYPE}}> {";
      code_ +=
          "  if let Self::{{NATIVE_VARIANT}}(v) = self "
          "{ Some(v.as_ref()) } else { None }";
      code_ += "}";
      // Mutable reference accessor.
      code_ +=
          "/// If the union variant matches, return a mutable reference"
          " to the {{U_ELEMENT_TABLE_TYPE}}.";
      code_ +=
          "pub fn as_{{U_ELEMENT_NAME}}_mut(&mut self) -> "
          "Option<&mut {{U_ELEMENT_TABLE_TYPE}}> {";
      code_ +=
          "  if let Self::{{NATIVE_VARIANT}}(v) = self "
          "{ Some(v.as_mut()) } else { None }";
      code_ += "}";
    });
    code_ += "}";  // End union methods impl.
  }